

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::SPxMainSM<double>::duplicateRows(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  int iVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  DataKey *pDVar4;
  Array<double> scale_00;
  Array<double> scale_01;
  DataArray<int> perm_00;
  DataArray<bool> isLhsEqualRhs;
  DataArray<bool> isLhsEqualRhs_00;
  shared_ptr<soplex::Tolerances> tols;
  shared_ptr<soplex::Tolerances> tols_00;
  undefined1 auVar5 [24];
  bool bVar6;
  bool bVar7;
  int k_tmp;
  int iVar8;
  SPxOut *pSVar9;
  ulong uVar10;
  pointer pDVar11;
  ulong *puVar12;
  undefined8 *puVar13;
  double *pdVar14;
  DuplicateRowsPS *this_00;
  long lVar15;
  uint n;
  long lVar16;
  int k_1;
  int iVar17;
  ulong uVar18;
  SPxLPBase<double> *pSVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int *piVar23;
  VectorBase<double> *pVVar24;
  Item *pIVar25;
  int k;
  ulong uVar26;
  ulong uVar27;
  DuplicateRowsPS *pDVar28;
  double dVar29;
  double dVar30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var32;
  Real RVar33;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a;
  undefined8 uVar34;
  Real in_stack_fffffffffffffd38;
  double dVar35;
  undefined1 in_stack_fffffffffffffd48;
  uint local_2b4;
  undefined8 in_stack_fffffffffffffd60;
  int *perm_tmp;
  SPxLPBase<double> *local_280;
  uint local_274;
  DuplicateRowsPS *local_270;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_268;
  VectorBase<double> *local_260;
  VectorBase<double> *local_258;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_250;
  int *idxMem;
  Result local_23c;
  IdxSet idxSet;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  int *perm;
  bool *local_1d8;
  DataArray<bool> remRow;
  DataArray<int> da_perm;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  DataArray<int> pClass;
  VectorBase<double> newLhsVec;
  Array<double> scale;
  DataArray<int> classSize;
  VectorBase<double> newRhsVec;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_d0;
  DataArray<bool> local_c0;
  DataArray<int> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  DataArray<bool> local_78;
  DataArray<int> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  iVar1 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_23c = removeEmpty(this,lp);
  if (local_23c == OKAY) {
    iVar8 = 0;
    iVar17 = 0;
    while( true ) {
      idxSet._vptr_IdxSet = (_func_int **)CONCAT44(idxSet._vptr_IdxSet._4_4_,iVar8);
      iVar20 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      if (iVar20 <= iVar8) break;
      pIVar25 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar20 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar8].idx;
      if (pIVar25[iVar20].data.super_SVectorBase<double>.memused == 1) {
        removeRowSingleton(this,lp,(SVectorBase<double> *)(pIVar25 + iVar20),(int *)&idxSet);
        iVar17 = iVar17 + 1;
        iVar8 = (int)idxSet._vptr_IdxSet;
      }
      iVar8 = iVar8 + 1;
    }
    if (((0 < iVar17) &&
        (pSVar9 = (this->super_SPxSimplifier<double>).spxout, pSVar9 != (SPxOut *)0x0)) &&
       (3 < (int)pSVar9->m_verbosity)) {
      idxSet._vptr_IdxSet = (_func_int **)CONCAT44(idxSet._vptr_IdxSet._4_4_,pSVar9->m_verbosity);
      pClass.thesize = 4;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                  "Simplifier duplicate rows (row singleton stage) removed ");
      pSVar9 = soplex::operator<<(pSVar9,iVar17);
      pSVar9 = soplex::operator<<(pSVar9," rows, ");
      pSVar9 = soplex::operator<<(pSVar9,iVar17);
      pSVar9 = soplex::operator<<(pSVar9," non-zeros");
      std::endl<char,std::char_traits<char>>(pSVar9->m_streams[pSVar9->m_verbosity]);
      pSVar9 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,&idxSet);
      iVar20 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    }
    local_23c = OKAY;
    if (1 < iVar20) {
      DataArray<int>::DataArray(&pClass,iVar20,0,1.2);
      DataArray<int>::DataArray
                (&classSize,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,0,
                 1.2);
      Array<double>::Array
                (&scale,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      idxSet.len = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      idxSet._vptr_IdxSet = (_func_int **)&PTR__IdxSet_0053d170;
      idxSet.num = 0;
      idxSet.idx = idxMem;
      idxSet.freeArray = false;
      *pClass.data = 0;
      *scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 0.0;
      iVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      *classSize.data = iVar8;
      for (lVar21 = 1; lVar21 < iVar8; lVar21 = lVar21 + 1) {
        pClass.data[lVar21] = 0;
        scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar21] = 0.0;
        classSize.data[lVar21] = 0;
        lVar22 = (long)idxSet.num;
        idxSet.num = idxSet.num + 1;
        idxMem[lVar22] = (int)lVar21;
        iVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      }
      local_250 = &(this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
      local_23c = INFEASIBLE;
      dVar29 = 0.0;
      p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_280 = lp;
      while (pSVar19 = local_280,
            (long)p_Var31 <
            (long)(local_280->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        pIVar25 = (local_280->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (local_280->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                  [(long)p_Var31].idx;
        lVar21 = 8;
        local_268 = p_Var31;
        for (lVar22 = 0; uVar10 = (ulong)(pIVar25->data).super_SVectorBase<double>.memused,
            lVar22 < (long)uVar10; lVar22 = lVar22 + 1) {
          pNVar3 = (pIVar25->data).super_SVectorBase<double>.m_elem;
          dVar35 = *(double *)((long)pNVar3 + lVar21 + -8);
          iVar8 = *(int *)((long)&pNVar3->val + lVar21);
          dVar30 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar8];
          if ((dVar30 == 0.0) && (!NAN(dVar30))) {
            scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar8] = dVar35;
            dVar30 = dVar35;
          }
          remRow._0_8_ = dVar35 / dVar30;
          DSVectorBase<double>::add
                    ((this->m_classSetRows).data.
                     super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pClass.data[iVar8],iVar8,
                     (double *)&remRow);
          piVar23 = classSize.data + pClass.data[iVar8];
          *piVar23 = *piVar23 + -1;
          if (*piVar23 == 0) {
            lVar16 = (long)idxSet.num;
            idxSet.num = idxSet.num + 1;
            idxSet.idx[lVar16] = pClass.data[iVar8];
          }
          lVar21 = lVar21 + 0x10;
        }
        for (lVar21 = 0; lVar21 < (int)uVar10; lVar21 = lVar21 + 1) {
          iVar8 = pClass.data[(pIVar25->data).super_SVectorBase<double>.m_elem[lVar21].idx];
          if (0 < (this->m_classSetRows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar8].super_SVectorBase<double>.memused
             ) {
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&remRow,
                       local_250);
            newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)Tolerances::epsilon((Tolerances *)remRow._0_8_);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&remRow.data);
            pDVar11 = (this->m_classSetRows).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar17 = pDVar11[iVar8].super_SVectorBase<double>.memused;
            if (1 < iVar17) {
              SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                        (pDVar11[iVar8].super_SVectorBase<double>.m_elem,iVar17,
                         (ElementCompare *)&newLhsVec,0,true);
              pDVar11 = (this->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            iVar17 = *idxSet.idx;
            lVar22 = (long)idxSet.num;
            idxSet.num = idxSet.num + -1;
            *idxSet.idx = idxSet.idx[lVar22 + -1];
            lVar22 = 0;
            lVar16 = 0;
            while( true ) {
              if (pDVar11[iVar8].super_SVectorBase<double>.memused <= lVar16) break;
              if (lVar22 != 0) {
                dVar35 = *(double *)
                          ((long)&(pDVar11[iVar8].super_SVectorBase<double>.m_elem)->val + lVar22);
                dVar30 = epsZero(this);
                bVar6 = NErel<double,double,double>(dVar35,dVar29,dVar30);
                if (bVar6) {
                  iVar17 = *idxSet.idx;
                  lVar15 = (long)idxSet.num;
                  idxSet.num = idxSet.num + -1;
                  *idxSet.idx = idxSet.idx[lVar15 + -1];
                }
              }
              pDVar11 = (this->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar3 = pDVar11[iVar8].super_SVectorBase<double>.m_elem;
              pClass.data[*(int *)((long)&pNVar3->idx + lVar22)] = iVar17;
              classSize.data[iVar17] = classSize.data[iVar17] + 1;
              dVar29 = *(double *)((long)&pNVar3->val + lVar22);
              lVar16 = lVar16 + 1;
              lVar22 = lVar22 + 0x10;
            }
            pDVar11[iVar8].super_SVectorBase<double>.memused = 0;
            uVar10 = (ulong)(uint)(pIVar25->data).super_SVectorBase<double>.memused;
          }
        }
        p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&local_268->_vptr__Sp_counted_base + 1);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      lVar21 = 0;
      DataArray<bool>::DataArray
                (&remRow,(pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,0,
                 1.2);
      n = (pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      pDVar11 = (this->m_dupRows).data.
                super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = 0;
      if (0 < (int)n) {
        uVar10 = (ulong)n;
      }
      for (; uVar10 * 0x20 != lVar21; lVar21 = lVar21 + 0x20) {
        *(undefined4 *)((long)&(pDVar11->super_SVectorBase<double>).memused + lVar21) = 0;
      }
      for (lVar21 = 0; lVar21 < (int)n; lVar21 = lVar21 + 1) {
        remRow.data[lVar21] = false;
        newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        DSVectorBase<double>::add
                  ((this->m_dupRows).data.
                   super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pClass.data[lVar21],(int)lVar21,
                   (double *)&newLhsVec);
        n = (pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      }
      perm_tmp = (int *)0x0;
      spx_alloc<int*>(&perm_tmp,n);
      uVar10 = 0;
      uVar26 = 0;
      if (0 < (int)n) {
        uVar26 = (ulong)n;
      }
      for (; uVar26 != uVar10; uVar10 = uVar10 + 1) {
        perm_tmp[uVar10] = 0;
      }
      pDVar11 = (this->m_dupRows).data.
                super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar25 = (pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
      pDVar4 = (pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey;
      local_2b4 = 0xffffffff;
      local_274 = local_2b4;
      for (lVar21 = 0;
          lVar21 < (pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar21 = lVar21 + 1) {
        iVar8 = pDVar11[lVar21].super_SVectorBase<double>.memused;
        if (1 < iVar8) {
          pNVar3 = pDVar11[lVar21].super_SVectorBase<double>.m_elem;
          if (pIVar25[pDVar4[pNVar3->idx].idx].data.super_SVectorBase<double>.memused != 1) {
            piVar23 = &pNVar3[1].idx;
            for (lVar22 = 1; lVar22 < iVar8; lVar22 = lVar22 + 1) {
              perm_tmp[*piVar23] = -1;
              iVar8 = pDVar11[lVar21].super_SVectorBase<double>.memused;
              piVar23 = piVar23 + 4;
            }
            local_274 = (uint)lVar21;
            if ((int)local_2b4 < 0) {
              local_2b4 = local_274;
            }
          }
        }
      }
      iVar8 = 0;
      for (uVar10 = 0; uVar26 != uVar10; uVar10 = uVar10 + 1) {
        if (-1 < perm_tmp[uVar10]) {
          perm_tmp[uVar10] = iVar8;
          iVar8 = iVar8 + 1;
        }
      }
      local_258 = &(pSVar19->super_LPRowSetBase<double>).left;
      std::vector<double,_std::allocator<double>_>::vector(&newLhsVec.val,&local_258->val);
      local_260 = &(pSVar19->super_LPRowSetBase<double>).right;
      std::vector<double,_std::allocator<double>_>::vector(&newRhsVec.val,&local_260->val);
      uVar10 = (ulong)local_274;
      bVar6 = false;
      for (uVar18 = 0;
          uVar27 = (ulong)(pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
          (long)uVar18 < (long)uVar27; uVar18 = uVar18 + 1) {
        pDVar11 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pDVar28 = (DuplicateRowsPS *)(uVar18 * 0x20);
        iVar8 = *(int *)((long)&(pDVar28->super_PostStep).nRows + (long)pDVar11);
        if ((1 < iVar8) &&
           ((pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
            [(pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
             [*(int *)(*(long *)((long)&(pDVar28->super_PostStep).m_name + (long)pDVar11) + 8)].idx]
            .data.super_SVectorBase<double>.memused != 1)) {
          piVar23 = (this->m_stat).data;
          piVar23[0xc] = iVar8 + piVar23[0xc] + -1;
          puVar12 = (ulong *)infinity();
          uVar27 = *puVar12;
          puVar13 = (undefined8 *)infinity();
          local_268 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar13;
          DataArray<bool>::DataArray
                    ((DataArray<bool> *)&perm,
                     *(int *)((long)&(pDVar28->super_PostStep).nRows +
                             (long)(this->m_dupRows).data.
                                   super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start),0,1.2);
          lVar21 = 8;
          lVar22 = 0;
          iVar8 = -1;
          iVar20 = -1;
          iVar17 = iVar8;
          local_270 = pDVar28;
          local_218 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar27 ^ 0x8000000000000000);
          while( true ) {
            pDVar28 = local_270;
            pDVar11 = (this->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (*(int *)((long)&(local_270->super_PostStep).nRows + (long)pDVar11) <= lVar22) break;
            iVar2 = *(int *)(*(long *)((long)&(local_270->super_PostStep).m_name + (long)pDVar11) +
                            lVar21);
            p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_258->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2];
            p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_260->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2];
            local_1d8[lVar22] = (double)p_Var31 == (double)p_Var32;
            if (iVar20 != -1) {
              dVar29 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar20] /
                       scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar2];
              pdVar14 = (double *)infinity();
              if (dVar29 <= 0.0) {
                if (*pdVar14 <= (double)p_Var32) {
                  puVar12 = (ulong *)infinity();
                  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (*puVar12 ^ 0x8000000000000000);
                }
                else {
                  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((local_260->val).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[iVar2] * dVar29);
                }
                pVVar24 = local_258;
                in_stack_fffffffffffffd60 = 0;
                dVar35 = (local_258->val).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar2];
                pdVar14 = (double *)infinity();
                if (dVar35 <= -*pdVar14) goto LAB_001b581b;
LAB_001b5806:
                p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (dVar29 * (pVVar24->val).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar2]);
              }
              else {
                if ((double)p_Var31 <= -*pdVar14) {
                  puVar12 = (ulong *)infinity();
                  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (*puVar12 ^ 0x8000000000000000);
                }
                else {
                  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((local_258->val).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[iVar2] * dVar29);
                }
                pVVar24 = local_260;
                in_stack_fffffffffffffd60 = 0;
                dVar35 = (local_260->val).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar2];
                pdVar14 = (double *)infinity();
                if (dVar35 < *pdVar14) goto LAB_001b5806;
LAB_001b581b:
                puVar13 = (undefined8 *)infinity();
                p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar13;
              }
              if ((double)local_218 < (double)p_Var31) {
                iVar8 = iVar2;
              }
              if ((double)p_Var32 < (double)local_268) {
                iVar17 = iVar2;
              }
              if ((double)p_Var31 <= (double)local_218) {
                p_Var31 = local_218;
              }
              if ((double)local_268 <= (double)p_Var32) {
                p_Var32 = local_268;
              }
              remRow.data[iVar2] = true;
              iVar2 = iVar20;
            }
            iVar20 = iVar2;
            lVar22 = lVar22 + 1;
            lVar21 = lVar21 + 0x10;
            local_268 = p_Var32;
            local_218 = p_Var31;
          }
          bVar7 = true;
          pSVar19 = local_280;
          if (iVar20 != -1) {
            p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_258->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar20];
            a._M_pi = local_218;
            if ((double)local_218 <= (double)p_Var31) {
              a._M_pi = p_Var31;
            }
            p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_260->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar20];
            p_Var32 = local_268;
            if ((double)p_Var31 <= (double)local_268) {
              p_Var32 = p_Var31;
            }
            if (uVar18 == uVar10) {
              DataArray<int>::DataArray(&da_perm,n,0,1.2);
              for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
                da_perm.data[uVar27] = perm_tmp[uVar27];
              }
              local_270 = (DuplicateRowsPS *)operator_new(0xd0);
              pDVar11 = (this->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              Array<double>::Array((Array<double> *)&local_48,&scale);
              DataArray<int>::DataArray(&local_60,&da_perm);
              DataArray<bool>::DataArray(&local_78,(DataArray<bool> *)&perm);
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_1f0,local_250);
              RVar33 = Tolerances::epsilon(local_1f0._M_ptr);
              bVar7 = EQrel<double,double,double>((double)a._M_pi,(double)p_Var32,RVar33);
              isLhsEqualRhs_00._1_7_ = 0;
              isLhsEqualRhs_00.thesize._0_1_ = local_274 == local_2b4;
              uVar34 = 0x1b5bbb;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_d0,local_250);
              pDVar28 = local_270;
              scale_01.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&local_60;
              scale_01.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&local_48;
              scale_01.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_78;
              perm_00.data = (int *)(ulong)bVar7;
              perm_00.thesize = 1;
              perm_00.themax = 0;
              perm_00.memFactor = (Real)&local_d0;
              isLhsEqualRhs_00.data = (bool *)uVar34;
              isLhsEqualRhs_00.memFactor = in_stack_fffffffffffffd38;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _4_4_ = iVar17;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _0_4_ = iVar8;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = a._M_pi;
              DuplicateRowsPS::DuplicateRowsPS
                        (local_270,local_280,iVar20,iVar8,iVar17,pDVar11 + uVar10,scale_01,perm_00,
                         isLhsEqualRhs_00,SUB81(p_Var32,0),(bool)in_stack_fffffffffffffd48,tols_00,
                         SUB81(in_stack_fffffffffffffd60,0));
              std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<soplex::SPxMainSM<double>::DuplicateRowsPS,void>
                        ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          *)&ptr,pDVar28);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_d0._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_1f0._M_refcount);
              DataArray<bool>::~DataArray(&local_78);
              DataArray<int>::~DataArray(&local_60);
              std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
              ::push_back(&(this->m_hist).data,(value_type *)&ptr);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&ptr.
                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              DataArray<int>::~DataArray(&da_perm);
            }
            else {
              DataArray<int>::DataArray(&da_perm,0,0,1.2);
              this_00 = (DuplicateRowsPS *)operator_new(0xd0);
              pDVar11 = (this->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              Array<double>::Array((Array<double> *)&local_90,&scale);
              DataArray<int>::DataArray(&local_a8,&da_perm);
              DataArray<bool>::DataArray(&local_c0,(DataArray<bool> *)&perm);
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_1f0,local_250);
              RVar33 = Tolerances::epsilon(local_1f0._M_ptr);
              bVar7 = EQrel<double,double,double>((double)a._M_pi,(double)p_Var32,RVar33);
              local_270 = (DuplicateRowsPS *)CONCAT71(local_270._1_7_,bVar7);
              uVar34 = 0x1b5a0a;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_e0,local_250);
              isLhsEqualRhs._1_7_ = 0;
              isLhsEqualRhs.thesize._0_1_ = uVar18 == local_2b4;
              scale_00.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&local_a8;
              scale_00.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&local_90;
              scale_00.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_c0;
              auVar5._8_8_ = &local_e0;
              auVar5._0_8_ = (ulong)local_270 & 0xff;
              auVar5._16_8_ = 0;
              isLhsEqualRhs.data = (bool *)uVar34;
              isLhsEqualRhs.memFactor = in_stack_fffffffffffffd38;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
                   iVar17;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                   iVar8;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = a._M_pi;
              DuplicateRowsPS::DuplicateRowsPS
                        (this_00,local_280,iVar20,iVar8,iVar17,
                         (DSVectorBase<double> *)
                         ((long)&(pDVar28->super_PostStep)._vptr_PostStep + (long)pDVar11),scale_00,
                         (DataArray<int>)(auVar5 << 0x40),isLhsEqualRhs,SUB81(p_Var32,0),
                         (bool)in_stack_fffffffffffffd48,tols,SUB81(in_stack_fffffffffffffd60,0));
              std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<soplex::SPxMainSM<double>::DuplicateRowsPS,void>
                        ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          *)&ptr,this_00);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_e0._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_1f0._M_refcount);
              DataArray<bool>::~DataArray(&local_c0);
              DataArray<int>::~DataArray(&local_a8);
              std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
              ::push_back(&(this->m_hist).data,(value_type *)&ptr);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&ptr.
                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              DataArray<int>::~DataArray(&da_perm);
            }
            pSVar19 = local_280;
            bVar7 = true;
            pdVar14 = (local_258->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar20;
            if ((*pdVar14 <= (double)local_218 && (double)local_218 != *pdVar14) ||
               ((double)local_268 <
                (local_260->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar20])) {
              dVar29 = feastol(this);
              bVar6 = LTrel<double,double,double>((double)p_Var32,(double)a._M_pi,dVar29);
              if (bVar6) {
                free(perm_tmp);
                perm_tmp = (int *)0x0;
                bVar6 = true;
                bVar7 = false;
              }
              else {
                newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar20] = (double)a._M_pi;
                if ((double)a._M_pi <= (double)p_Var32) {
                  a._M_pi = p_Var32;
                }
                newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar20] = (double)a._M_pi;
                bVar7 = true;
                bVar6 = true;
              }
            }
          }
          DataArray<bool>::~DataArray((DataArray<bool> *)&perm);
          if (!bVar7) goto LAB_001b5f2e;
        }
      }
      if (bVar6) {
        (*(pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x38])
                  (pSVar19,&newLhsVec,&newRhsVec,0);
        uVar27 = (ulong)(uint)(pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                              thenum;
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,(int)uVar27);
      pIVar25 = (pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
      pDVar4 = (pSVar19->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey;
      uVar26 = 0;
      uVar10 = uVar27 & 0xffffffff;
      if ((int)uVar27 < 1) {
        uVar10 = uVar26;
      }
      iVar17 = 0;
      iVar8 = 0;
      for (; uVar10 != uVar26; uVar26 = uVar26 + 1) {
        if (remRow.data[uVar26] == true) {
          perm[uVar26] = -1;
          iVar8 = iVar8 + 1;
          iVar17 = iVar17 + pIVar25[pDVar4[uVar26].idx].data.super_SVectorBase<double>.memused;
        }
        else {
          perm[uVar26] = 0;
        }
      }
      (*(local_280->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x11])(local_280,perm);
      piVar23 = (this->m_rIdx).data;
      for (uVar26 = 0; uVar10 != uVar26; uVar26 = uVar26 + 1) {
        if (-1 < (long)perm[uVar26]) {
          piVar23[perm[uVar26]] = piVar23[uVar26];
        }
      }
      free(perm);
      perm = (int *)0x0;
      free(perm_tmp);
      perm_tmp = (int *)0x0;
      if (iVar8 + iVar17 != 0 && SCARRY4(iVar8,iVar17) == iVar8 + iVar17 < 0) {
        piVar23 = &(this->super_SPxSimplifier<double>).m_remRows;
        *piVar23 = *piVar23 + iVar8;
        piVar23 = &(this->super_SPxSimplifier<double>).m_remNzos;
        *piVar23 = *piVar23 + iVar17;
        pSVar9 = (this->super_SPxSimplifier<double>).spxout;
        if ((pSVar9 != (SPxOut *)0x0) && (3 < (int)pSVar9->m_verbosity)) {
          ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._0_4_ = 4;
          da_perm.thesize = pSVar9->m_verbosity;
          (*pSVar9->_vptr_SPxOut[2])();
          pSVar9 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                      "Simplifier (duplicate rows) removed ");
          pSVar9 = soplex::operator<<(pSVar9,iVar8);
          pSVar9 = soplex::operator<<(pSVar9," rows, ");
          pSVar9 = soplex::operator<<(pSVar9,iVar17);
          pSVar9 = soplex::operator<<(pSVar9," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar9->m_streams[pSVar9->m_verbosity]);
          pSVar9 = (this->super_SPxSimplifier<double>).spxout;
          (*pSVar9->_vptr_SPxOut[2])(pSVar9,&da_perm);
        }
        if ((double)iVar1 * (this->super_SPxSimplifier<double>).m_minReduction < (double)iVar8) {
          *again = true;
        }
      }
      local_23c = OKAY;
LAB_001b5f2e:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&newRhsVec);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&newLhsVec);
      DataArray<bool>::~DataArray(&remRow);
      IdxSet::~IdxSet(&idxSet);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&scale);
      DataArray<int>::~DataArray(&classSize);
      DataArray<int>::~DataArray(&pClass);
    }
  }
  return local_23c;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}